

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O3

int __thiscall ncnn::InnerProduct::load_param(InnerProduct *this,ParamDict *pd)

{
  int iVar1;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->num_output = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->bias_term = iVar1;
  iVar1 = ParamDict::get(pd,2,0);
  this->weight_data_size = iVar1;
  iVar1 = ParamDict::get(pd,8,0);
  this->int8_scale_term = iVar1;
  this->use_int8_inference = iVar1 != 0 && pd->use_int8_inference != 0;
  return 0;
}

Assistant:

int InnerProduct::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    bias_term = pd.get(1, 0);
    weight_data_size = pd.get(2, 0);
    int8_scale_term = pd.get(8, 0);

    use_int8_inference = pd.use_int8_inference;

    if (int8_scale_term == 0)
        use_int8_inference = false;

    return 0;
}